

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_bin_ugrid_pack_cell
          (FILE *file,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_FILEPOS conn_offset,
          REF_FILEPOS faceid_offset,REF_INT section_size,REF_LONG ncell_read,REF_INT node_per,
          REF_INT size_per,REF_GLOB *c2n)

{
  ulong uVar1;
  int iVar2;
  void *__ptr;
  size_t sVar3;
  ulong uVar4;
  REF_GLOB *pRVar5;
  long *plVar6;
  undefined8 uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  void *pvVar12;
  
  uVar8 = node_per * section_size;
  if (sixty_four_bit == 0) {
    if ((int)uVar8 < 0) {
      pcVar11 = "malloc c2t of REF_INT negative";
      uVar7 = 0x454;
      goto LAB_00175a07;
    }
    uVar10 = (ulong)uVar8;
    __ptr = malloc(uVar10 * 4);
    if (__ptr == (void *)0x0) {
      pcVar11 = "malloc c2t of REF_INT NULL";
      uVar7 = 0x454;
      goto LAB_00175919;
    }
    lVar9 = (long)node_per;
    iVar2 = fseeko((FILE *)file,ncell_read * 4 * lVar9 + conn_offset,0);
    if (iVar2 == 0) {
      sVar3 = fread(__ptr,4,uVar10,(FILE *)file);
      if (sVar3 != uVar10) {
        pcVar11 = "cn";
        uVar7 = 0x45b;
        goto LAB_00175754;
      }
      if (uVar8 != 0) {
        uVar4 = 0;
        do {
          if (swap_endian != 0) {
            uVar8 = *(uint *)((long)__ptr + uVar4 * 4);
            *(uint *)((long)__ptr + uVar4 * 4) =
                 uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
          }
          uVar4 = uVar4 + 1;
        } while (uVar10 != uVar4);
      }
      if (0 < section_size) {
        uVar10 = 0;
        pvVar12 = __ptr;
        pRVar5 = c2n;
        do {
          if (0 < node_per) {
            uVar4 = 0;
            do {
              pRVar5[uVar4] = (long)*(int *)((long)pvVar12 + uVar4 * 4) + -1;
              uVar4 = uVar4 + 1;
            } while ((uint)node_per != uVar4);
          }
          uVar10 = uVar10 + 1;
          pRVar5 = pRVar5 + size_per;
          pvVar12 = (void *)((long)pvVar12 + lVar9 * 4);
        } while (uVar10 != (uint)section_size);
      }
      if (node_per == size_per) goto LAB_001759da;
      if (section_size < 0) {
        pcVar11 = "malloc tag of REF_INT negative";
        uVar7 = 0x466;
        goto LAB_00175a07;
      }
      uVar10 = (ulong)(uint)section_size;
      pvVar12 = malloc(uVar10 * 4);
      if (pvVar12 == (void *)0x0) {
        pcVar11 = "malloc tag of REF_INT NULL";
        uVar7 = 0x466;
        goto LAB_00175919;
      }
      iVar2 = fseeko((FILE *)file,ncell_read * 4 + faceid_offset,0);
      if (iVar2 == 0) {
        sVar3 = fread(pvVar12,4,uVar10,(FILE *)file);
        if (sVar3 != uVar10) {
          pcVar11 = "tag";
          uVar7 = 0x46c;
          goto LAB_00175a07;
        }
        if (section_size != 0) {
          uVar4 = 0;
          do {
            if (swap_endian != 0) {
              uVar8 = *(uint *)((long)pvVar12 + uVar4 * 4);
              *(uint *)((long)pvVar12 + uVar4 * 4) =
                   uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
            }
            uVar4 = uVar4 + 1;
          } while (uVar10 != uVar4);
          if (section_size != 0) {
            plVar6 = c2n + lVar9;
            uVar4 = 0;
            do {
              *plVar6 = (long)*(int *)((long)pvVar12 + uVar4 * 4);
              uVar4 = uVar4 + 1;
              plVar6 = plVar6 + size_per;
            } while (uVar10 != uVar4);
          }
        }
        goto LAB_00175c4f;
      }
      sVar3 = (size_t)iVar2;
      pcVar11 = "seek tag failed";
      uVar7 = 0x46a;
    }
    else {
      sVar3 = (size_t)iVar2;
      pcVar11 = "seek conn failed";
      uVar7 = 0x458;
    }
  }
  else {
    if ((int)uVar8 < 0) {
      pcVar11 = "malloc c2t of REF_LONG negative";
      uVar7 = 0x430;
LAB_00175a07:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
             "ref_part_bin_ugrid_pack_cell",pcVar11);
      return 1;
    }
    uVar10 = (ulong)uVar8;
    __ptr = malloc(uVar10 * 8);
    if (__ptr == (void *)0x0) {
      pcVar11 = "malloc c2t of REF_LONG NULL";
      uVar7 = 0x430;
LAB_00175919:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
             "ref_part_bin_ugrid_pack_cell",pcVar11);
      return 2;
    }
    lVar9 = (long)node_per;
    iVar2 = fseeko((FILE *)file,ncell_read * 8 * lVar9 + conn_offset,0);
    if (iVar2 == 0) {
      sVar3 = fread(__ptr,8,uVar10,(FILE *)file);
      if (sVar3 != uVar10) {
        pcVar11 = "cn";
        uVar7 = 0x437;
        goto LAB_00175a07;
      }
      if (uVar8 != 0) {
        uVar4 = 0;
        do {
          if (swap_endian != 0) {
            uVar1 = *(ulong *)((long)__ptr + uVar4 * 8);
            *(ulong *)((long)__ptr + uVar4 * 8) =
                 uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
          }
          uVar4 = uVar4 + 1;
        } while (uVar10 != uVar4);
      }
      if (0 < section_size) {
        uVar10 = 0;
        pvVar12 = __ptr;
        pRVar5 = c2n;
        do {
          if (0 < node_per) {
            uVar4 = 0;
            do {
              pRVar5[uVar4] = *(long *)((long)pvVar12 + uVar4 * 8) + -1;
              uVar4 = uVar4 + 1;
            } while ((uint)node_per != uVar4);
          }
          uVar10 = uVar10 + 1;
          pRVar5 = pRVar5 + size_per;
          pvVar12 = (void *)((long)pvVar12 + lVar9 * 8);
        } while (uVar10 != (uint)section_size);
      }
      if (node_per == size_per) goto LAB_001759da;
      if (section_size < 0) {
        pcVar11 = "malloc tag of REF_LONG negative";
        uVar7 = 0x442;
        goto LAB_00175a07;
      }
      uVar10 = (ulong)(uint)section_size;
      pvVar12 = malloc(uVar10 * 8);
      if (pvVar12 == (void *)0x0) {
        pcVar11 = "malloc tag of REF_LONG NULL";
        uVar7 = 0x442;
        goto LAB_00175919;
      }
      iVar2 = fseeko((FILE *)file,ncell_read * 8 + faceid_offset,0);
      if (iVar2 == 0) {
        sVar3 = fread(pvVar12,8,uVar10,(FILE *)file);
        if (sVar3 != uVar10) {
          pcVar11 = "tag";
          uVar7 = 0x448;
          goto LAB_00175a07;
        }
        if (section_size != 0) {
          uVar4 = 0;
          do {
            if (swap_endian != 0) {
              uVar1 = *(ulong *)((long)pvVar12 + uVar4 * 8);
              *(ulong *)((long)pvVar12 + uVar4 * 8) =
                   uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                   (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                   (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                   | uVar1 << 0x38;
            }
            uVar4 = uVar4 + 1;
          } while (uVar10 != uVar4);
          if (section_size != 0) {
            pRVar5 = c2n + lVar9;
            uVar4 = 0;
            do {
              *pRVar5 = *(REF_GLOB *)((long)pvVar12 + uVar4 * 8);
              uVar4 = uVar4 + 1;
              pRVar5 = pRVar5 + size_per;
            } while (uVar10 != uVar4);
          }
        }
LAB_00175c4f:
        free(pvVar12);
LAB_001759da:
        free(__ptr);
        return 0;
      }
      sVar3 = (size_t)iVar2;
      pcVar11 = "seek tag failed";
      uVar7 = 0x446;
    }
    else {
      sVar3 = (size_t)iVar2;
      pcVar11 = "seek conn failed";
      uVar7 = 0x434;
    }
  }
  uVar10 = 0;
LAB_00175754:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
         "ref_part_bin_ugrid_pack_cell",pcVar11,uVar10,sVar3);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_pack_cell(
    FILE *file, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset, REF_INT section_size,
    REF_LONG ncell_read, REF_INT node_per, REF_INT size_per, REF_GLOB *c2n) {
  REF_INT cell, node;
  REF_FILEPOS ibyte;
  ibyte = (sixty_four_bit ? 8 : 4);

  if (sixty_four_bit) {
    REF_LONG *c2t;
    ref_malloc(c2t, node_per * section_size, REF_LONG);
    REIS(0,
         fseeko(file, conn_offset + ibyte * node_per * (REF_FILEPOS)ncell_read,
                SEEK_SET),
         "seek conn failed");
    RES((size_t)(section_size * node_per),
        fread(c2t, sizeof(REF_LONG), (size_t)(section_size * node_per), file),
        "cn");
    for (cell = 0; cell < section_size * node_per; cell++) {
      if (swap_endian) SWAP_LONG(c2t[cell]);
    }
    for (cell = 0; cell < section_size; cell++) {
      for (node = 0; node < node_per; node++) {
        c2n[node + size_per * cell] = c2t[node + node_per * cell] - 1;
      }
    }
    if (node_per != size_per) {
      REF_LONG *tag;
      ref_malloc(tag, section_size, REF_LONG);
      REIS(0,
           fseeko(file, faceid_offset + ibyte * (REF_FILEPOS)ncell_read,
                  SEEK_SET),
           "seek tag failed");
      RES((size_t)(section_size),
          fread(tag, sizeof(REF_LONG), (size_t)section_size, file), "tag");
      for (cell = 0; cell < section_size; cell++) {
        if (swap_endian) SWAP_LONG(tag[cell]);
      }
      /* sort into right locations */
      for (cell = 0; cell < section_size; cell++)
        c2n[node_per + cell * size_per] = tag[cell];
      ref_free(tag);
    }
    ref_free(c2t);
  } else {
    REF_INT *c2t;
    ref_malloc(c2t, node_per * section_size, REF_INT);
    REIS(0,
         fseeko(file, conn_offset + ibyte * node_per * (REF_FILEPOS)ncell_read,
                SEEK_SET),
         "seek conn failed");
    REIS((size_t)(section_size * node_per),
         fread(c2t, sizeof(REF_INT), (size_t)(section_size * node_per), file),
         "cn");
    for (cell = 0; cell < section_size * node_per; cell++) {
      if (swap_endian) SWAP_INT(c2t[cell]);
    }
    for (cell = 0; cell < section_size; cell++) {
      for (node = 0; node < node_per; node++) {
        c2n[node + size_per * cell] = c2t[node + node_per * cell] - 1;
      }
    }
    if (node_per != size_per) {
      REF_INT *tag;
      ref_malloc(tag, section_size, REF_INT);
      REIS(0,
           fseeko(file, faceid_offset + ibyte * (REF_FILEPOS)ncell_read,
                  SEEK_SET),
           "seek tag failed");
      RES((size_t)(section_size),
          fread(tag, sizeof(REF_INT), (size_t)section_size, file), "tag");
      for (cell = 0; cell < section_size; cell++) {
        if (swap_endian) SWAP_INT(tag[cell]);
      }
      /* sort into right locations */
      for (cell = 0; cell < section_size; cell++)
        c2n[node_per + cell * size_per] = tag[cell];
      ref_free(tag);
    }
    ref_free(c2t);
  }
  return REF_SUCCESS;
}